

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_visit_parents(ggml_cgraph *cgraph,ggml_tensor *node)

{
  ggml_cgraph *in_RSI;
  int *in_RDI;
  int i_2;
  int i_1;
  int i;
  int local_1c;
  int iVar1;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < *in_RDI; iVar2 = iVar2 + 1) {
    if (*(ggml_cgraph **)(in_RDI + (long)iVar2 * 2 + 8) == in_RSI) {
      return;
    }
  }
  for (iVar1 = 0; iVar1 < in_RDI[1]; iVar1 = iVar1 + 1) {
    if (*(ggml_cgraph **)(in_RDI + (long)iVar1 * 2 + 0x4008) == in_RSI) {
      return;
    }
  }
  if (in_RSI->nodes[5] != (ggml_tensor *)0x0) {
    ggml_visit_parents(in_RSI,(ggml_tensor *)CONCAT44(iVar2,iVar1));
  }
  if (in_RSI->nodes[6] != (ggml_tensor *)0x0) {
    ggml_visit_parents(in_RSI,(ggml_tensor *)CONCAT44(iVar2,iVar1));
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    if (in_RSI->nodes[(long)local_1c + 7] != (ggml_tensor *)0x0) {
      ggml_visit_parents(in_RSI,(ggml_tensor *)CONCAT44(iVar2,iVar1));
    }
  }
  if ((*(int *)(in_RSI->nodes + 3) == 0) && (in_RSI->nodes[4] == (ggml_tensor *)0x0)) {
    if (0xfff < in_RDI[1]) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
              0x2333,"cgraph->n_leafs < GGML_MAX_NODES");
      abort();
    }
    *(ggml_cgraph **)(in_RDI + (long)in_RDI[1] * 2 + 0x4008) = in_RSI;
    in_RDI[1] = in_RDI[1] + 1;
  }
  else {
    if (0xfff < *in_RDI) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
              0x2338,"cgraph->n_nodes < GGML_MAX_NODES");
      abort();
    }
    *(ggml_cgraph **)(in_RDI + (long)*in_RDI * 2 + 8) = in_RSI;
    *(ggml_tensor **)(in_RDI + (long)*in_RDI * 2 + 0x2008) = in_RSI->nodes[4];
    *in_RDI = *in_RDI + 1;
  }
  return;
}

Assistant:

static void ggml_visit_parents(struct ggml_cgraph * cgraph, struct ggml_tensor * node) {
    if (node->grad == NULL) {
        // this usually happens when we generate intermediate nodes from constants in the backward pass
        // it can also happen during forward pass, if the user performs computations with constants
        if (node->op != GGML_OP_NONE) {
            //GGML_PRINT_DEBUG("%s: warning: node %p has no grad, but op %d\n", __func__, (void *) node, node->op);
        }
    }

    // check if already visited
    for (int i = 0; i < cgraph->n_nodes; i++) {
        if (cgraph->nodes[i] == node) {
            return;
        }
    }

    for (int i = 0; i < cgraph->n_leafs; i++) {
        if (cgraph->leafs[i] == node) {
            return;
        }
    }

    if (node->src0) {
        ggml_visit_parents(cgraph, node->src0);
    }

    if (node->src1) {
        ggml_visit_parents(cgraph, node->src1);
    }

    for (int i = 0; i < GGML_MAX_OPT; ++i) {
        if (node->opt[i]) {
            ggml_visit_parents(cgraph, node->opt[i]);
        }
    }

    if (node->op == GGML_OP_NONE && node->grad == NULL) {
        // reached a leaf node, not part of the gradient graph (e.g. a constant)
        GGML_ASSERT(cgraph->n_leafs < GGML_MAX_NODES);

        cgraph->leafs[cgraph->n_leafs] = node;
        cgraph->n_leafs++;
    } else {
        GGML_ASSERT(cgraph->n_nodes < GGML_MAX_NODES);

        cgraph->nodes[cgraph->n_nodes] = node;
        cgraph->grads[cgraph->n_nodes] = node->grad;
        cgraph->n_nodes++;
    }
}